

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libquat_vec.cpp
# Opt level: O2

vec_3d operator^(vec_3d *a,vec_3d *b)

{
  undefined4 uVar1;
  undefined4 uVar2;
  vec_3d vVar3;
  
  uVar1 = b->x;
  uVar2 = b->y;
  vVar3.y = b->z * -a->x + a->z * (float)uVar1;
  vVar3.x = b->z * a->y + -a->z * (float)uVar2;
  vVar3.z = (float)uVar2 * a->x - a->y * (float)uVar1;
  return vVar3;
}

Assistant:

vec_3d operator^(const vec_3d &a, const vec_3d &b) {
    vec_3d out{0.f};  // better this way to avoid copying results to input
                      // vectors themselves
    out.x = a.y * b.z - a.z * b.y;
    out.y = -a.x * b.z + a.z * b.x;
    out.z = a.x * b.y - a.y * b.x;

    return out;
}